

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDF::copyForeignObject(QPDF *this,QPDFObjectHandle *foreign)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  QPDFObjectHandle *pQVar3;
  mapped_type *obj_copier;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_type sVar5;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  qpdf_offset_t offset;
  logic_error *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *peVar8;
  QPDFObjectHandle QVar9;
  allocator<char> local_1c1;
  QPDFObjectHandle *local_1c0;
  element_type *local_1b8;
  QPDFObjectHandle *local_1b0;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_1a8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *local_1a0;
  QPDFObjGen og;
  QPDFObjGen og_1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 local_150 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_140;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  QPDFObjectHandle copy;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)in_RDX);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&copy,"",(allocator<char> *)&og_1);
    pQVar3 = (QPDFObjectHandle *)
             QPDFObjectHandle::getQPDF((QPDFObjectHandle *)in_RDX,(string *)&copy);
    std::__cxx11::string::~string((string *)&copy);
    if (pQVar3 == foreign) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"QPDF::copyForeign called with object from this QPDF");
    }
    else {
      obj_copier = std::
                   map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
                   ::operator[]((map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
                                 *)&(foreign->super_BaseHandle).obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr[6].qpdf,
                                &((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
                                   &(pQVar3->super_BaseHandle).obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  ).super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                 unique_id);
      if ((obj_copier->visiting).
          super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
          super__Rb_tree_header._M_node_count == 0) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_140,in_RDX);
        reserveObjects((QPDF *)foreign,(QPDFObjectHandle *)&local_140,obj_copier,true);
        local_1c0 = foreign;
        local_1b8 = (element_type *)this;
        local_1b0 = pQVar3;
        local_1a0 = in_RDX;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
        if ((obj_copier->visiting).
            super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
            super__Rb_tree_header._M_node_count == 0) {
          local_1a8 = &obj_copier->to_copy;
          p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   (obj_copier->to_copy).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (p_Var6 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                        (obj_copier->to_copy).
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start; p_Var6 != p_Var1;
              p_Var6 = p_Var6 + 1) {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_150,p_Var6);
            replaceForeignIndirectObjects
                      ((QPDF *)&copy,local_1c0,(ObjCopier *)local_150,SUB81(obj_copier,0));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
            bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)p_Var6);
            if (!bVar2) {
              og_1 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)p_Var6);
              p_Var4 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                       std::
                       map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                       ::operator[](&obj_copier->object_map,&og_1);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_160,p_Var4);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_170,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&copy);
              replaceReserved((QPDF *)local_1c0,(QPDFObjectHandle *)&local_160,
                              (QPDFObjectHandle *)&local_170);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_170._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_160._M_refcount);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&copy.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::clear(local_1a8);
          og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_1a0);
          sVar5 = std::
                  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                  ::count(&obj_copier->object_map,&og);
          if (sVar5 == 0) {
            getFilename_abi_cxx11_(&local_d0,(QPDF *)local_1b0);
            std::operator+(&local_f0,&local_d0," object ");
            peVar8 = local_1b8;
            QPDFObjGen::unparse_abi_cxx11_(&local_110,&og,' ');
            pQVar3 = local_1c0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &og_1,&local_f0,&local_110);
            offset = QPDFObjectHandle::getParsedOffset((QPDFObjectHandle *)local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,
                       "unexpected reference to /Pages object while copying foreign object; replacing with null"
                       ,&local_1c1);
            damagedPDF((QPDFExc *)&copy,(QPDF *)pQVar3,(string *)&og_1,offset,&local_130);
            warn((QPDF *)pQVar3,(QPDFExc *)&copy);
            QPDFExc::~QPDFExc((QPDFExc *)&copy);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&og_1);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            QVar9 = QPDFObjectHandle::newNull();
            _Var7._M_pi = QVar9.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
          }
          else {
            copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_1a0);
            p_Var6 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                     std::
                     map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                     ::operator[](&obj_copier->object_map,(key_type *)&copy);
            peVar8 = local_1b8;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_1b8,p_Var6);
            _Var7._M_pi = extraout_RDX;
          }
          QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Var7._M_pi;
          QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar8;
          return (QPDFObjectHandle)
                 QVar9.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
        }
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"obj_copier.visiting is not empty after reserving objects");
      }
      else {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"obj_copier.visiting is not empty at the beginning of copyForeignObject")
        ;
      }
    }
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDF::copyForeign called with direct object handle");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFObjectHandle
QPDF::copyForeignObject(QPDFObjectHandle foreign)
{
    // Here's an explanation of what's going on here.
    //
    // A QPDFObjectHandle that is an indirect object has an owning QPDF. The object ID and
    // generation refers to an object in the owning QPDF. When we copy the QPDFObjectHandle from a
    // foreign QPDF into the local QPDF, we have to replace all indirect object references with
    // references to the corresponding object in the local file.
    //
    // To do this, we maintain mappings from foreign object IDs to local object IDs for each foreign
    // QPDF that we are copying from. The mapping is stored in an ObjCopier, which contains a
    // mapping from the foreign ObjGen to the local QPDFObjectHandle.
    //
    // To copy, we do a deep traversal of the foreign object with loop detection to discover all
    // indirect objects that are encountered, stopping at page boundaries. Whenever we encounter an
    // indirect object, we check to see if we have already created a local copy of it. If not, we
    // allocate a "reserved" object (or, for a stream, just a new stream) and store in the map the
    // mapping from the foreign object ID to the new object. While we
    // do this, we keep a list of objects to copy.
    //
    // Once we are done with the traversal, we copy all the objects that we need to copy. However,
    // the copies will contain indirect object IDs that refer to objects in the foreign file. We
    // need to replace them with references to objects in the local file. This is what
    // replaceForeignIndirectObjects does. Once we have created a copy of the foreign object with
    // all the indirect references replaced with new ones in the local context, we can replace the
    // local reserved object with the copy. This mechanism allows us to copy objects with circular
    // references in any order.

    // For streams, rather than copying the objects, we set up the stream data to pull from the
    // original stream by using a stream data provider. This is done in a manner that doesn't
    // require the original QPDF object but may require the original source of the stream data with
    // special handling for immediate_copy_from. This logic is also in
    // replaceForeignIndirectObjects.

    // Note that we explicitly allow use of copyForeignObject on page objects. It is a documented
    // use case to copy pages this way if the intention is to not update the pages tree.
    if (!foreign.isIndirect()) {
        QTC::TC("qpdf", "QPDF copyForeign direct");
        throw std::logic_error("QPDF::copyForeign called with direct object handle");
    }
    QPDF& other = foreign.getQPDF();
    if (&other == this) {
        QTC::TC("qpdf", "QPDF copyForeign not foreign");
        throw std::logic_error("QPDF::copyForeign called with object from this QPDF");
    }

    ObjCopier& obj_copier = m->object_copiers[other.m->unique_id];
    if (!obj_copier.visiting.empty()) {
        throw std::logic_error(
            "obj_copier.visiting is not empty at the beginning of copyForeignObject");
    }

    // Make sure we have an object in this file for every referenced object in the old file.
    // obj_copier.object_map maps foreign QPDFObjGen to local objects.  For everything new that we
    // have to copy, the local object will be a reservation, unless it is a stream, in which case
    // the local object will already be a stream.
    reserveObjects(foreign, obj_copier, true);

    if (!obj_copier.visiting.empty()) {
        throw std::logic_error("obj_copier.visiting is not empty after reserving objects");
    }

    // Copy any new objects and replace the reservations.
    for (auto& to_copy: obj_copier.to_copy) {
        QPDFObjectHandle copy = replaceForeignIndirectObjects(to_copy, obj_copier, true);
        if (!to_copy.isStream()) {
            QPDFObjGen og(to_copy.getObjGen());
            replaceReserved(obj_copier.object_map[og], copy);
        }
    }
    obj_copier.to_copy.clear();

    auto og = foreign.getObjGen();
    if (!obj_copier.object_map.count(og)) {
        warn(damagedPDF(
            other.getFilename() + " object " + og.unparse(' '),
            foreign.getParsedOffset(),
            "unexpected reference to /Pages object while copying foreign object; replacing with "
            "null"));
        return QPDFObjectHandle::newNull();
    }
    return obj_copier.object_map[foreign.getObjGen()];
}